

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcFIFO.h
# Opt level: O1

long * __thiscall o3dgc::FIFO<long>::PopFirst(FIFO<long> *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  
  if (this->m_size != 0) {
    this->m_size = this->m_size - 1;
    uVar2 = this->m_start;
    uVar1 = uVar2 + 1;
    this->m_start = uVar1;
    if (uVar1 == this->m_allocated) {
      this->m_end = 0;
    }
    return this->m_buffer + uVar2;
  }
  __assert_fail("m_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/Open3DGC/o3dgcFIFO.h"
                ,0x40,"const T &o3dgc::FIFO<long>::PopFirst() [T = long]");
}

Assistant:

const T &               PopFirst()
                                {
                                    assert(m_size > 0);
                                    --m_size;
                                    unsigned long current = m_start++;
                                    if (m_start == m_allocated) 
                                    {
                                        m_end = 0;
                                    }
                                    return m_buffer[current];
                                }